

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

Error * ot::commissioner::coap::Message::Deserialize
                  (Error *__return_storage_ptr__,OptionType *aOptionNumber,OptionValue *aOptionValue
                  ,uint16_t aLastOptionNumber,ByteArray *aBuf,size_t *aOffset)

{
  value_type vVar1;
  OptionType OVar2;
  size_type sVar3;
  byte *pbVar4;
  ulong uVar5;
  size_type sVar6;
  const_reference pvVar7;
  basic_string_view<char> bVar8;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  short local_768;
  short local_764;
  allocator<unsigned_char> local_719;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_718;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_710;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_708;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_700;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_6f8;
  ByteArray local_6f0;
  OptionValue local_6d8;
  anon_class_1_0_00000001 local_6ba;
  v10 local_6b9;
  v10 *local_6b8;
  size_t local_6b0;
  string local_6a8;
  Error local_688;
  anon_class_1_0_00000001 local_65a;
  v10 local_659;
  v10 *local_658;
  char *local_650;
  string local_648;
  Error local_628;
  anon_class_1_0_00000001 local_5fa;
  v10 local_5f9;
  v10 *local_5f8;
  size_t local_5f0;
  string local_5e8;
  Error local_5c8;
  anon_class_1_0_00000001 local_59a;
  v10 local_599;
  v10 *local_598;
  char *local_590;
  string local_588;
  Error local_568;
  anon_class_1_0_00000001 local_53a;
  v10 local_539;
  v10 *local_538;
  size_t local_530;
  string local_528;
  Error local_508;
  anon_class_1_0_00000001 local_4ca;
  v10 local_4c9;
  v10 *local_4c8;
  size_t local_4c0;
  string local_4b8;
  Error local_498;
  size_type local_470;
  size_t extend;
  size_t firstByte;
  uint16_t valueLength;
  uint16_t length;
  uint16_t delta;
  size_t *aOffset_local;
  ByteArray *aBuf_local;
  OptionValue *pOStack_440;
  uint16_t aLastOptionNumber_local;
  OptionValue *aOptionValue_local;
  OptionType *aOptionNumber_local;
  Error *error;
  undefined1 local_410 [16];
  v10 *local_400;
  ulong local_3f8;
  v10 *local_3f0;
  size_t sStack_3e8;
  string *local_3e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_3d8 [3];
  undefined1 local_3c0 [16];
  v10 *local_3b0;
  ulong local_3a8;
  v10 *local_3a0;
  size_t sStack_398;
  string *local_390;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_388 [3];
  undefined1 local_370 [16];
  v10 *local_360;
  ulong local_358;
  v10 *local_350;
  size_t sStack_348;
  string *local_340;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_338 [3];
  undefined1 local_320 [16];
  v10 *local_310;
  ulong local_308;
  v10 *local_300;
  size_t sStack_2f8;
  string *local_2f0;
  v10 *local_2e8;
  v10 **local_2e0;
  v10 *local_2d8;
  v10 **local_2d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  *local_2c8 [2];
  undefined1 local_2b8 [16];
  v10 *local_2a8;
  char *local_2a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  *local_298;
  v10 *local_290;
  char *pcStack_288;
  string *local_280;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  *local_278 [3];
  undefined1 local_260 [16];
  v10 *local_250;
  char *local_248;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  *local_240;
  v10 *local_238;
  char *pcStack_230;
  string *local_228;
  v10 *local_220;
  v10 **local_218;
  v10 *local_210;
  v10 **local_208;
  v10 *local_200;
  v10 **local_1f8;
  v10 *local_1f0;
  v10 **local_1e8;
  v10 **local_1e0;
  v10 *local_1d8;
  size_t sStack_1d0;
  v10 **local_1c0;
  v10 *local_1b8;
  size_t sStack_1b0;
  v10 **local_1a0;
  v10 *local_198;
  size_t sStack_190;
  v10 **local_180;
  v10 *local_178;
  size_t sStack_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_160;
  undefined1 *local_158;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_150;
  undefined8 local_148;
  undefined1 *local_140;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_138;
  undefined1 *local_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_128;
  undefined8 local_120;
  undefined1 *local_118;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_110;
  undefined1 *local_108;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_100;
  undefined8 local_f8;
  undefined1 *local_f0;
  Error **local_e8;
  undefined1 *local_e0;
  Error **local_d8;
  undefined8 local_d0;
  undefined1 *local_c8;
  Error **local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_a8;
  v10 **local_a0;
  v10 *local_98;
  char *pcStack_90;
  v10 **local_80;
  v10 *local_78;
  char *pcStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  **local_58;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  **local_50;
  undefined8 local_48;
  undefined1 *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  firstByte._7_1_ = 0;
  _valueLength = aOffset;
  aOffset_local = (size_t *)aBuf;
  aBuf_local._6_2_ = aLastOptionNumber;
  pOStack_440 = aOptionValue;
  aOptionValue_local = (OptionValue *)aOptionNumber;
  aOptionNumber_local = (OptionType *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  uVar5 = *_valueLength;
  local_470 = *_valueLength + 1;
  extend = uVar5;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)aOffset_local);
  if (uVar5 < sVar3) {
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)aOffset_local,
                        extend);
    firstByte._4_2_ = (ushort)((int)(uint)*pbVar4 >> 4);
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)aOffset_local,
                        extend);
    firstByte._0_2_ = *pbVar4 & 0xf;
    if (firstByte._4_2_ < 0xd) {
      local_764 = 0;
    }
    else {
      local_764 = 2;
      if (firstByte._4_2_ < 0xe) {
        local_764 = 1;
      }
    }
    if ((ushort)firstByte < 0xd) {
      local_768 = 0;
    }
    else {
      local_768 = 2;
      if ((ushort)firstByte < 0xe) {
        local_768 = 1;
      }
    }
    firstByte._2_2_ = local_764 + 1 + local_768;
    uVar5 = extend + firstByte._2_2_;
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)aOffset_local);
    sVar3 = local_470;
    if (sVar6 < uVar5) {
      Deserialize::anon_class_1_0_00000001::operator()(&local_53a);
      local_2d0 = &local_538;
      local_2d8 = &local_539;
      bVar8 = ::fmt::v10::operator()(local_2d8);
      local_530 = bVar8.size_;
      local_538 = (v10 *)bVar8.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_340 = &local_528;
      local_350 = local_538;
      sStack_348 = local_530;
      local_1c0 = &local_350;
      local_360 = local_538;
      local_358 = local_530;
      local_1b8 = local_360;
      sStack_1b0 = local_358;
      local_388[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_130 = local_370;
      local_138 = local_388;
      local_120 = 0;
      fmt_00.size_ = 0;
      fmt_00.data_ = (char *)local_358;
      args_00.field_1 =
           (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
            )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )aOffset;
      args_00.desc_ = (unsigned_long_long)local_138;
      local_128 = local_138;
      local_118 = local_130;
      local_b0 = local_138;
      ::fmt::v10::vformat_abi_cxx11_(&local_528,local_360,fmt_00,args_00);
      Error::Error(&local_508,kBadFormat,&local_528);
      Error::operator=(__return_storage_ptr__,&local_508);
      Error::~Error(&local_508);
      std::__cxx11::string::~string((string *)&local_528);
    }
    else {
      if (0xc < firstByte._4_2_) {
        if (firstByte._4_2_ == 0xd) {
          local_470 = local_470 + 1;
          pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)aOffset_local
                              ,sVar3);
          firstByte._4_2_ = *pbVar4 + 0xd;
        }
        else {
          if (firstByte._4_2_ != 0xe) {
            if ((ushort)firstByte != 0xf) {
              Deserialize::anon_class_1_0_00000001::operator()(&local_59a);
              local_218 = &local_598;
              local_220 = &local_599;
              bVar8 = ::fmt::v10::operator()(local_220);
              local_590 = (char *)bVar8.size_;
              local_598 = (v10 *)bVar8.data_;
              ::fmt::v10::detail::check_format_string<const_unsigned_char_&,_FMT_COMPILE_STRING,_0>
                        ();
              local_240 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
                           *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        aOffset_local,extend);
              local_228 = &local_588;
              local_238 = local_598;
              pcStack_230 = local_590;
              local_a0 = &local_238;
              local_250 = local_598;
              local_248 = local_590;
              local_98 = local_250;
              pcStack_90 = local_248;
              local_278[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_char_const>
                                       (local_240,(v10 *)local_228,(uchar *)local_598);
              local_60 = local_260;
              local_68 = local_278;
              local_48 = 2;
              fmt_01.size_ = 2;
              fmt_01.data_ = local_248;
              args_01.field_1 =
                   (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                    )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                      )aOffset;
              args_01.desc_ = (unsigned_long_long)local_68;
              local_58 = local_68;
              local_50 = local_68;
              local_40 = local_60;
              ::fmt::v10::vformat_abi_cxx11_(&local_588,local_250,fmt_01,args_01);
              Error::Error(&local_568,kBadFormat,&local_588);
              Error::operator=(__return_storage_ptr__,&local_568);
              Error::~Error(&local_568);
              std::__cxx11::string::~string((string *)&local_588);
              return __return_storage_ptr__;
            }
            Deserialize::anon_class_1_0_00000001::operator()(&local_5fa);
            local_208 = &local_5f8;
            local_210 = &local_5f9;
            bVar8 = ::fmt::v10::operator()(local_210);
            local_5f0 = bVar8.size_;
            local_5f8 = (v10 *)bVar8.data_;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            local_390 = &local_5e8;
            local_3a0 = local_5f8;
            sStack_398 = local_5f0;
            local_1a0 = &local_3a0;
            local_3b0 = local_5f8;
            local_3a8 = local_5f0;
            local_198 = local_3b0;
            sStack_190 = local_3a8;
            local_3d8[0] = ::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
            local_108 = local_3c0;
            local_110 = local_3d8;
            local_f8 = 0;
            fmt_02.size_ = 0;
            fmt_02.data_ = (char *)local_3a8;
            args_02.field_1 =
                 (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                  )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                    )aOffset;
            args_02.desc_ = (unsigned_long_long)local_110;
            local_100 = local_110;
            local_f0 = local_108;
            local_b8 = local_110;
            ::fmt::v10::vformat_abi_cxx11_(&local_5e8,local_3b0,fmt_02,args_02);
            Error::Error(&local_5c8,kNotFound,&local_5e8);
            Error::operator=(__return_storage_ptr__,&local_5c8);
            Error::~Error(&local_5c8);
            std::__cxx11::string::~string((string *)&local_5e8);
            return __return_storage_ptr__;
          }
          pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)aOffset_local
                              ,local_470);
          vVar1 = *pvVar7;
          pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)aOffset_local
                              ,local_470 + 1);
          firstByte._4_2_ = CONCAT11(vVar1,*pvVar7) + 0x10d;
          local_470 = local_470 + 2;
        }
      }
      sVar3 = local_470;
      if (0xc < (ushort)firstByte) {
        if ((ushort)firstByte == 0xd) {
          local_470 = local_470 + 1;
          pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)aOffset_local
                              ,sVar3);
          firstByte._0_2_ = *pbVar4 + 0xd;
        }
        else {
          if ((ushort)firstByte != 0xe) {
            Deserialize::anon_class_1_0_00000001::operator()(&local_65a);
            local_1f8 = &local_658;
            local_200 = &local_659;
            bVar8 = ::fmt::v10::operator()(local_200);
            local_650 = (char *)bVar8.size_;
            local_658 = (v10 *)bVar8.data_;
            ::fmt::v10::detail::check_format_string<const_unsigned_char_&,_FMT_COMPILE_STRING,_0>();
            local_298 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
                         *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      aOffset_local,extend);
            local_280 = &local_648;
            local_290 = local_658;
            pcStack_288 = local_650;
            local_80 = &local_290;
            local_2a8 = local_658;
            local_2a0 = local_650;
            local_78 = local_2a8;
            pcStack_70 = local_2a0;
            local_2c8[0] = ::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_char_const>
                                     (local_298,(v10 *)local_280,(uchar *)local_658);
            local_30 = local_2b8;
            local_38 = local_2c8;
            local_18 = 2;
            fmt_03.size_ = 2;
            fmt_03.data_ = local_2a0;
            args_03.field_1 =
                 (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                  )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                    )aOffset;
            args_03.desc_ = (unsigned_long_long)local_38;
            local_28 = local_38;
            local_20 = local_38;
            local_10 = local_30;
            ::fmt::v10::vformat_abi_cxx11_(&local_648,local_2a8,fmt_03,args_03);
            Error::Error(&local_628,kBadFormat,&local_648);
            Error::operator=(__return_storage_ptr__,&local_628);
            Error::~Error(&local_628);
            std::__cxx11::string::~string((string *)&local_648);
            return __return_storage_ptr__;
          }
          pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)aOffset_local
                              ,local_470);
          vVar1 = *pvVar7;
          pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)aOffset_local
                              ,local_470 + 1);
          firstByte._0_2_ = CONCAT11(vVar1,*pvVar7) + 0x10d;
          local_470 = local_470 + 2;
        }
      }
      if (extend + firstByte._2_2_ != local_470) {
        abort();
      }
      uVar5 = (ushort)firstByte + local_470;
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)aOffset_local);
      if (sVar3 < uVar5) {
        Deserialize::anon_class_1_0_00000001::operator()(&local_6ba);
        local_1e8 = &local_6b8;
        local_1f0 = &local_6b9;
        bVar8 = ::fmt::v10::operator()(local_1f0);
        local_6b0 = bVar8.size_;
        local_6b8 = (v10 *)bVar8.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_3e0 = &local_6a8;
        local_3f0 = local_6b8;
        sStack_3e8 = local_6b0;
        local_180 = &local_3f0;
        local_400 = local_6b8;
        local_3f8 = local_6b0;
        local_178 = local_400;
        sStack_170 = local_3f8;
        error = (Error *)::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
        ;
        local_e0 = local_410;
        local_e8 = &error;
        local_d0 = 0;
        fmt_04.size_ = 0;
        fmt_04.data_ = (char *)local_3f8;
        args_04.field_1 =
             (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                )aOffset;
        args_04.desc_ = (unsigned_long_long)local_e8;
        local_d8 = local_e8;
        local_c8 = local_e0;
        local_c0 = local_e8;
        ::fmt::v10::vformat_abi_cxx11_(&local_6a8,local_400,fmt_04,args_04);
        Error::Error(&local_688,kBadFormat,&local_6a8);
        Error::operator=(__return_storage_ptr__,&local_688);
        Error::~Error(&local_688);
        std::__cxx11::string::~string((string *)&local_6a8);
      }
      else {
        OVar2 = utils::from_underlying<ot::commissioner::coap::OptionType>
                          (aBuf_local._6_2_ + firstByte._4_2_);
        *(OptionType *)
         &(aOptionValue_local->mValue).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = OVar2;
        local_700._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 aOffset_local);
        local_6f8 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+(&local_700,local_470);
        local_718._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 aOffset_local);
        local_710 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+(&local_718,local_470);
        local_708 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+(&local_710,(ulong)(ushort)firstByte);
        std::allocator<unsigned_char>::allocator(&local_719);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_6f0,local_6f8,
                   local_708,&local_719);
        OptionValue::OptionValue(&local_6d8,&local_6f0);
        OptionValue::operator=(pOStack_440,&local_6d8);
        OptionValue::~OptionValue(&local_6d8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_6f0);
        std::allocator<unsigned_char>::~allocator(&local_719);
        *_valueLength = (long)(int)((uint)firstByte._2_2_ + (uint)(ushort)firstByte) + *_valueLength
        ;
      }
    }
  }
  else {
    Deserialize::anon_class_1_0_00000001::operator()(&local_4ca);
    local_2e0 = &local_4c8;
    local_2e8 = &local_4c9;
    bVar8 = ::fmt::v10::operator()(local_2e8);
    local_4c0 = bVar8.size_;
    local_4c8 = (v10 *)bVar8.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_2f0 = &local_4b8;
    local_300 = local_4c8;
    sStack_2f8 = local_4c0;
    local_1e0 = &local_300;
    local_310 = local_4c8;
    local_308 = local_4c0;
    local_1d8 = local_310;
    sStack_1d0 = local_308;
    local_338[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_158 = local_320;
    local_160 = local_338;
    local_148 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_308;
    args.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                    )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                      )aOffset;
    args.desc_ = (unsigned_long_long)local_160;
    local_150 = local_160;
    local_140 = local_158;
    local_a8 = local_160;
    ::fmt::v10::vformat_abi_cxx11_(&local_4b8,local_310,fmt,args);
    Error::Error(&local_498,kBadFormat,&local_4b8);
    Error::operator=(__return_storage_ptr__,&local_498);
    Error::~Error(&local_498);
    std::__cxx11::string::~string((string *)&local_4b8);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::Deserialize(OptionType      &aOptionNumber,
                           OptionValue     &aOptionValue,
                           uint16_t         aLastOptionNumber,
                           const ByteArray &aBuf,
                           size_t          &aOffset)
{
    Error    error;
    uint16_t delta;
    uint16_t length;
    uint16_t valueLength;
    size_t   firstByte = aOffset;
    size_t   extend    = aOffset + 1;

    VerifyOrExit(firstByte < aBuf.size(), error = ERROR_BAD_FORMAT("premature end of a CoAP option"));

    delta       = aBuf[firstByte] >> 4;
    valueLength = aBuf[firstByte] & 0x0f;

    length = 1;
    length += delta < kOption1ByteExtension ? 0 : (delta < kOption2ByteExtension ? 1 : 2);
    length += valueLength < kOption1ByteExtension ? 0 : (valueLength < kOption2ByteExtension ? 1 : 2);

    VerifyOrExit(firstByte + length <= aBuf.size(), error = ERROR_BAD_FORMAT("premature end of a CoAP option"));

    if (delta < kOption1ByteExtension)
    {
        // do nothing
    }
    else if (delta == kOption1ByteExtension)
    {
        delta = kOption1ByteExtensionOffset + aBuf[extend++];
    }
    else if (delta == kOption2ByteExtension)
    {
        delta = kOption2ByteExtensionOffset + ((static_cast<uint16_t>(aBuf[extend]) << 8) | aBuf[extend + 1]);
        extend += 2;
    }
    else
    {
        // we have delta == 0x0f

        VerifyOrExit(valueLength == 0x0f,
                     error = ERROR_BAD_FORMAT("invalid CoAP option (firstByte={:X})", aBuf[firstByte]));
        ExitNow(error = ERROR_NOT_FOUND("cannot find more CoAP option"));
    }

    if (valueLength < kOption1ByteExtension)
    {
        // do nothing
    }
    else if (valueLength == kOption1ByteExtension)
    {
        valueLength = kOption1ByteExtensionOffset + aBuf[extend++];
    }
    else if (valueLength == kOption2ByteExtension)
    {
        valueLength = kOption2ByteExtensionOffset + ((static_cast<uint16_t>(aBuf[extend]) << 8) | aBuf[extend + 1]);
        extend += 2;
    }
    else
    {
        ExitNow(error = ERROR_BAD_FORMAT("invalid CoAP option (firstByte={:X})", aBuf[firstByte]));
    }

    VerifyOrDie(firstByte + length == extend);

    VerifyOrExit(valueLength + extend <= aBuf.size(), error = ERROR_BAD_FORMAT("premature end of a CoAP option"));

    aOptionNumber = utils::from_underlying<OptionType>(aLastOptionNumber + delta);
    aOptionValue  = OptionValue{ByteArray{aBuf.begin() + extend, aBuf.begin() + extend + valueLength}};

    aOffset += length + valueLength;

exit:
    return error;
}